

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

RunResult __thiscall
wabt::interp::Thread::DoSimdShift<long,long>(Thread *this,BinopFunc<long,_long> *f)

{
  long lVar1;
  u8 i;
  long lVar2;
  Value VVar3;
  SR result;
  Simd<long,_(unsigned_char)__x02_> lhs;
  anon_union_16_6_113bff37_for_Value_0 local_40;
  anon_union_16_6_113bff37_for_Value_0 local_30;
  
  VVar3 = Pop(this);
  local_30.v128_.v = (v128)Pop(this);
  for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
    lVar1 = (*f)(*(long *)((long)&local_30 + lVar2 * 8),VVar3.field_0.i64_ & 0xffffffff);
    *(long *)((long)&local_40 + lVar2 * 8) = lVar1;
  }
  Push(this,(Value)local_40.v128_.v);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdShift(BinopFunc<R, T> f) {
  using ST = typename Simd128<T>::Type;
  using SR = typename Simd128<R>::Type;
  static_assert(ST::lanes == SR::lanes, "SIMD lanes don't match");
  auto amount = Pop<u32>();
  auto lhs = Pop<ST>();
  SR result;
  for (u8 i = 0; i < SR::lanes; ++i) {
    result[i] = f(lhs[i], amount);
  }
  Push(result);
  return RunResult::Ok;
}